

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_96de3f::Target::DumpArchive(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  Value *pVVar2;
  Value local_c8;
  undefined1 local_a0 [8];
  string lang;
  undefined1 local_48 [8];
  Value commandFragments;
  Target *this_local;
  Value *archive;
  
  commandFragments.limit_._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  DumpLinkCommandFragments((Value *)local_48,this);
  bVar1 = Json::Value::empty((Value *)local_48);
  if (!bVar1) {
    Json::Value::Value((Value *)((long)&lang.field_2 + 8),(Value *)local_48);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"commandFragments");
    Json::Value::operator=(pVVar2,(Value *)((long)&lang.field_2 + 8));
    Json::Value::~Value((Value *)((long)&lang.field_2 + 8));
  }
  Json::Value::~Value((Value *)local_48);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_a0,this->GT,this->Config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)local_a0,this->Config);
  if (bVar1) {
    Json::Value::Value(&local_c8,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"lto");
    Json::Value::operator=(pVVar2,&local_c8);
    Json::Value::~Value(&local_c8);
  }
  commandFragments.limit_._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_a0);
  if ((commandFragments.limit_._7_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpArchive()
{
  Json::Value archive = Json::objectValue;
  {
    // The "link" fragments not relevant to static libraries are empty.
    Json::Value commandFragments = this->DumpLinkCommandFragments();
    if (!commandFragments.empty()) {
      archive["commandFragments"] = std::move(commandFragments);
    }
  }
  std::string lang = this->GT->GetLinkerLanguage(this->Config);
  if (this->GT->IsIPOEnabled(lang, this->Config)) {
    archive["lto"] = true;
  }
  return archive;
}